

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ExprNodeNext_TERM(Fts5Expr *pExpr,Fts5ExprNode *pNode,int bFromValid,i64 iFrom)

{
  Fts5IndexIter *pIndexIter;
  Fts5IndexIter *pIter;
  int rc;
  i64 iFrom_local;
  int bFromValid_local;
  Fts5ExprNode *pNode_local;
  Fts5Expr *pExpr_local;
  
  pIndexIter = pNode->pNear->apPhrase[0]->aTerm[0].pIter;
  if (bFromValid == 0) {
    pIter._4_4_ = sqlite3Fts5IterNext(pIndexIter);
  }
  else {
    pIter._4_4_ = sqlite3Fts5IterNextFrom(pIndexIter,iFrom);
  }
  if ((pIter._4_4_ == 0) && (pIndexIter->bEof == '\0')) {
    pIter._4_4_ = fts5ExprNodeTest_TERM(pExpr,pNode);
  }
  else {
    pNode->bEof = 1;
    pNode->bNomatch = 0;
  }
  return pIter._4_4_;
}

Assistant:

static int fts5ExprNodeNext_TERM(
  Fts5Expr *pExpr, 
  Fts5ExprNode *pNode,
  int bFromValid,
  i64 iFrom
){
  int rc;
  Fts5IndexIter *pIter = pNode->pNear->apPhrase[0]->aTerm[0].pIter;

  assert( pNode->bEof==0 );
  if( bFromValid ){
    rc = sqlite3Fts5IterNextFrom(pIter, iFrom);
  }else{
    rc = sqlite3Fts5IterNext(pIter);
  }
  if( rc==SQLITE_OK && sqlite3Fts5IterEof(pIter)==0 ){
    rc = fts5ExprNodeTest_TERM(pExpr, pNode);
  }else{
    pNode->bEof = 1;
    pNode->bNomatch = 0;
  }
  return rc;
}